

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

HandlePtr __thiscall
dg::vr::ValueRelations::getCorresponding
          (ValueRelations *this,ValueRelations *other,Handle otherH,
          VectorSet<const_llvm::Value_*> *otherEqual)

{
  bool bVar1;
  HandlePtr pBVar2;
  HandlePtr pBVar3;
  ValueRelations *in_RDI;
  Relations *in_stack_00000038;
  Bucket *in_stack_00000040;
  HandlePtr oH;
  V val;
  const_iterator __end2;
  const_iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  HandlePtr mH;
  bool ch;
  Handle h;
  HandlePtr thisFromH;
  Handle otherFromH;
  HandlePtr thisH;
  undefined4 in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffff3c;
  Bucket *in_stack_ffffffffffffff40;
  Bucket *in_stack_ffffffffffffff48;
  Handle in_stack_ffffffffffffff50;
  Bucket *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  reference_wrapper<const_dg::vr::Bucket> in_stack_ffffffffffffff70;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_68 [2];
  HandlePtr local_58;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  Bucket *in_stack_ffffffffffffffb8;
  ValueRelations *in_stack_ffffffffffffffc0;
  Bucket *in_stack_ffffffffffffffc8;
  ValueRelations *in_stack_ffffffffffffffd0;
  HandlePtr local_8;
  
  bVar1 = VectorSet<const_llvm::Value_*>::empty((VectorSet<const_llvm::Value_*> *)0x209d41);
  if (bVar1) {
    bVar1 = Bucket::hasRelation(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    if (bVar1) {
      Bucket::getRelated(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      pBVar3 = getCorresponding((ValueRelations *)in_stack_ffffffffffffff60,in_RDI,
                                in_stack_ffffffffffffff50);
      if (pBVar3 == (HandlePtr)0x0) {
        local_8 = (HandlePtr)0x0;
      }
      else {
        local_8 = newPlaceholderBucket<dg::vr::Bucket>
                            ((ValueRelations *)
                             CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                             in_stack_ffffffffffffff60);
        bVar1 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                          ((RelationsGraph<dg::vr::ValueRelations> *)__end2._M_current,(Bucket *)val
                           ,oH._4_4_,in_stack_00000040,in_stack_00000038);
        updateChanged(in_RDI,bVar1);
      }
    }
    else {
      getBorderId((ValueRelations *)in_stack_ffffffffffffff40,
                  (Handle)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_8 = getBorderH((ValueRelations *)in_stack_ffffffffffffff40,
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (local_8 == (HandlePtr)0x0) {
        getBorderId((ValueRelations *)in_stack_ffffffffffffff40,
                    (Handle)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_8 = newBorderBucket((ValueRelations *)in_stack_ffffffffffffff60,(size_t)in_RDI);
      }
    }
  }
  else {
    local_58 = (HandlePtr)0x0;
    local_68[0]._M_current =
         (Value **)
         VectorSet<const_llvm::Value_*>::begin
                   ((VectorSet<const_llvm::Value_*> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    VectorSet<const_llvm::Value_*>::end
              ((VectorSet<const_llvm::Value_*> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator*(local_68);
      pBVar2 = maybeGet((ValueRelations *)in_stack_ffffffffffffff60,(V)in_RDI);
      pBVar3 = pBVar2;
      if (((local_58 != (HandlePtr)0x0) && (pBVar3 = local_58, pBVar2 != (HandlePtr)0x0)) &&
         (pBVar2 != local_58)) {
        bVar1 = hasConflictingRelation<dg::vr::Bucket,dg::vr::Bucket>
                          ((ValueRelations *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        if (bVar1) {
          return (HandlePtr)0x0;
        }
        set<dg::vr::Bucket,dg::vr::Bucket>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                   (Type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8);
        pBVar3 = maybeGet((ValueRelations *)in_stack_ffffffffffffff60,(V)in_RDI);
      }
      local_58 = pBVar3;
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++(local_68);
    }
    local_8 = local_58;
    if (local_58 == (HandlePtr)0x0) {
      VectorSet<const_llvm::Value_*>::any((VectorSet<const_llvm::Value_*> *)0x209fc6);
      RelationsGraph<dg::vr::ValueRelations>::getNewBucket
                ((RelationsGraph<dg::vr::ValueRelations> *)in_stack_ffffffffffffff70._M_data);
      add(in_stack_ffffffffffffffc0,(V)in_stack_ffffffffffffffb8,
          (Handle)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      local_8 = std::reference_wrapper<const_dg::vr::Bucket>::get
                          ((reference_wrapper<const_dg::vr::Bucket> *)&stack0xffffffffffffff70);
    }
  }
  return local_8;
}

Assistant:

ValueRelations::HandlePtr
ValueRelations::getCorresponding(const ValueRelations &other, Handle otherH,
                                 const VectorSet<V> &otherEqual) {
    if (otherEqual.empty()) { // other is a placeholder bucket, therefore it is
                              // pointed to from other bucket
        if (!otherH.hasRelation(Relations::PF)) {
            HandlePtr thisH = getBorderH(other.getBorderId(otherH));
            return thisH ? thisH : &newBorderBucket(other.getBorderId(otherH));
        }
        assert(otherH.hasRelation(Relations::PF));
        Handle otherFromH = otherH.getRelated(Relations::PF);
        HandlePtr thisFromH = getCorresponding(other, otherFromH);
        if (!thisFromH)
            return nullptr;

        Handle h = newPlaceholderBucket(*thisFromH);
        bool ch = graph.addRelation(*thisFromH, Relations::PT, h);
        updateChanged(ch);
        return &h;
    }

    // otherwise find unique handle for all equal elements from other
    HandlePtr mH = nullptr;
    for (V val : otherEqual) {
        HandlePtr oH = maybeGet(val);
        if (!mH) // first handle found
            mH = oH;
        else if (oH && oH != mH) { // found non-equal handle in this
            if (hasConflictingRelation(*oH, *mH, Relations::EQ))
                return nullptr;
            set(*oH, Relations::EQ, *mH);
            mH = maybeGet(val); // update possibly invalidated handle
            assert(mH);
        }
    }
    return mH ? mH : &add(otherEqual.any(), graph.getNewBucket()).first.get();
}